

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::
storage(storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag> *this,
       random_engine *rng,quadratic_cost_type<double> *costs_,double cost_constant_,
       int population_size,int variables,
       vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       *constraints_)

{
  int iVar1;
  quadratic_cost_type<double> *pqVar2;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints;
  bool bVar3;
  result_type_conflict3 rVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  double *pdVar9;
  reference x_optimistic;
  const_reference pvVar10;
  reference pfVar11;
  iterator __first;
  iterator __last;
  double dVar12;
  function_element *elem_1;
  const_iterator __end5;
  const_iterator __begin5;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range5;
  int sum;
  int end_k;
  int k;
  int e_2;
  int i_2;
  double local_c8;
  double local_c0;
  int local_b4;
  int local_b0;
  int e_1;
  int i_1;
  int v;
  double local_a0;
  double local_98;
  bernoulli_distribution local_90;
  bernoulli_distribution dist;
  int e;
  int i;
  reference local_70;
  raw_result<baryonyx::itm::minimize_tag> *elem;
  iterator __end0;
  iterator __begin0;
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  *__range3;
  allocator<int> local_39;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_38;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints__local;
  int variables_local;
  int population_size_local;
  double cost_constant__local;
  quadratic_cost_type<double> *costs__local;
  random_engine *rng_local;
  storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag> *this_local;
  
  local_38 = constraints_;
  constraints__local._0_4_ = variables;
  constraints__local._4_4_ = population_size;
  _variables_local = cost_constant_;
  cost_constant__local = (double)costs_;
  costs__local = (quadratic_cost_type<double> *)rng;
  rng_local = (random_engine *)this;
  std::shared_mutex::shared_mutex(&this->m_indices_mutex);
  sVar7 = (size_type)constraints__local._4_4_;
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_indices,sVar7,&local_39);
  std::allocator<int>::~allocator(&local_39);
  sVar7 = (size_type)constraints__local._4_4_;
  std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>::allocator
            ((allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_> *)((long)&__range3 + 3))
  ;
  std::
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  ::vector(&this->m_data,sVar7,
           (allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_> *)((long)&__range3 + 3));
  std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>::~allocator
            ((allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_> *)((long)&__range3 + 3))
  ;
  bit_array::bit_array(&this->m_bastert,(int)constraints__local);
  bit_array::bit_array(&this->m_random,(int)constraints__local);
  this->costs = (quadratic_cost_type<double> *)cost_constant__local;
  this->cost_constant = _variables_local;
  this->m_size = constraints__local._4_4_;
  __end0 = std::
           vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ::begin(&this->m_data);
  elem = (raw_result<baryonyx::itm::minimize_tag> *)
         std::
         vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
         ::end(&this->m_data);
  while (bVar3 = __gnu_cxx::
                 operator==<baryonyx::raw_result<baryonyx::itm::minimize_tag>_*,_std::vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>_>
                           (&__end0,(__normal_iterator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_*,_std::vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>_>
                                     *)&elem), ((bVar3 ^ 0xffU) & 1) != 0) {
    local_70 = __gnu_cxx::
               __normal_iterator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_*,_std::vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>_>
               ::operator*(&__end0);
    bit_array::bit_array((bit_array *)&e,(int)constraints__local);
    bit_array::operator=(&local_70->x,(bit_array *)&e);
    bit_array::~bit_array((bit_array *)&e);
    __gnu_cxx::
    __normal_iterator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_*,_std::vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>_>
    ::operator++(&__end0);
  }
  init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
            (&this->m_bastert,(quadratic_cost_type<double> *)cost_constant__local,
             (int)constraints__local,0);
  dist._M_param._M_p._4_4_ = 0;
  dist._M_param._M_p._0_4_ = this->m_size / 2;
  for (; dist._M_param._M_p._4_4_ != dist._M_param._M_p._0_4_;
      dist._M_param._M_p._4_4_ = dist._M_param._M_p._4_4_ + 1) {
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)dist._M_param._M_p._4_4_);
    bit_array::operator=(&pvVar8->x,&this->m_bastert);
    local_98 = (double)dist._M_param._M_p._4_4_ / (double)(dist._M_param._M_p._0_4_ * 5);
    local_a0 = 0.0;
    _i_1 = 1.0;
    pdVar9 = std::clamp<double>(&local_98,&local_a0,(double *)&i_1);
    std::bernoulli_distribution::bernoulli_distribution(&local_90,*pdVar9);
    for (e_1 = 0; e_1 != (int)constraints__local; e_1 = e_1 + 1) {
      rVar4 = std::bernoulli_distribution::operator()
                        (&local_90,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         costs__local);
      if (rVar4) {
        pvVar8 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)dist._M_param._M_p._4_4_);
        bit_array_impl::invert((bit_array_impl *)pvVar8,e_1);
      }
    }
  }
  local_b4 = this->m_size;
  for (local_b0 = this->m_size / 2; local_b0 + 1 < local_b4; local_b0 = local_b0 + 2) {
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)local_b0);
    init_with_random(&pvVar8->x,(random_engine *)costs__local,(int)constraints__local,0.2);
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)(local_b0 + 1));
    init_with_random(&pvVar8->x,(random_engine *)costs__local,(int)constraints__local,0.8);
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)local_b0);
    x_optimistic = std::
                   vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                   ::operator[](&this->m_data,(long)(local_b0 + 1));
    pqVar2 = costs__local;
    dVar12 = cost_constant__local;
    constraints = local_38;
    local_c0 = (double)local_b0 / (double)(local_b4 * 5);
    local_c8 = 0.0;
    _e_2 = 1.0;
    pdVar9 = std::clamp<double>(&local_c0,&local_c8,(double *)&e_2);
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              (&pvVar8->x,&x_optimistic->x,(random_engine *)pqVar2,
               (quadratic_cost_type<double> *)dVar12,constraints,*pdVar9);
  }
  k = 0;
  iVar1 = this->m_size;
  for (; k != iVar1; k = k + 1) {
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)k);
    raw_result<baryonyx::itm::minimize_tag>::make_hash(pvVar8);
    pqVar2 = this->costs;
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)k);
    dVar12 = quadratic_cost_type<double>::results(pqVar2,&pvVar8->x,_variables_local);
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)k);
    pvVar8->value = dVar12;
    pvVar8 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)k);
    pvVar8->remaining_constraints = 0;
    sum = 0;
    iVar5 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                      (local_38);
    for (; sum != iVar5; sum = sum + 1) {
      __range5._4_4_ = 0;
      pvVar10 = std::
                vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                ::operator[](local_38,(long)sum);
      __end5 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::begin(&pvVar10->elements);
      elem_1 = (function_element *)
               std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::end(&pvVar10->elements);
      while (bVar3 = __gnu_cxx::
                     operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                               (&__end5,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                         *)&elem_1), ((bVar3 ^ 0xffU) & 1) != 0) {
        pfVar11 = __gnu_cxx::
                  __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                  ::operator*(&__end5);
        pvVar8 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)k);
        iVar6 = bit_array::operator[](&pvVar8->x,pfVar11->variable_index);
        if (iVar6 != 0) {
          __range5._4_4_ = pfVar11->factor + __range5._4_4_;
        }
        __gnu_cxx::
        __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
        ::operator++(&__end5);
      }
      pvVar10 = std::
                vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                ::operator[](local_38,(long)sum);
      if ((__range5._4_4_ < pvVar10->min) ||
         (pvVar10 = std::
                    vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    ::operator[](local_38,(long)sum), pvVar10->max < __range5._4_4_)) {
        pvVar8 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)k);
        pvVar8->remaining_constraints = pvVar8->remaining_constraints + 1;
      }
    }
  }
  __first = std::begin<std::vector<int,std::allocator<int>>>(&this->m_indices);
  __last = std::end<std::vector<int,std::allocator<int>>>(&this->m_indices);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,0)
  ;
  sort(this);
  return;
}

Assistant:

storage(random_engine& rng,
            const Cost& costs_,
            const double cost_constant_,
            const int population_size,
            const int variables,
            const std::vector<merged_constraint>& constraints_)
      : m_indices(population_size)
      , m_data(population_size)
      , m_bastert(variables)
      , m_random(variables)
      , costs(costs_)
      , cost_constant(cost_constant_)
      , m_size(population_size)
    {
        for (auto& elem : m_data)
            elem.x = bit_array(variables);

        init_with_bastert<Cost, Mode>(m_bastert, costs_, variables, 0);

        for (int i = 0, e = m_size / 2; i != e; ++i) {
            m_data[i].x = m_bastert;

            std::bernoulli_distribution dist(
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));

            for (int v = 0; v != variables; ++v)
                if (dist(rng))
                    m_data[i].x.invert(v);
        }

        for (int i = m_size / 2, e = m_size; i + 1 < e; i += 2) {
            init_with_random(m_data[i].x, rng, variables, 0.2);
            init_with_random(m_data[i + 1].x, rng, variables, 0.8);

            init_with_pre_solve<Cost, Mode>(
              m_data[i].x,
              m_data[i + 1].x,
              rng,
              costs_,
              constraints_,
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));
        }

        for (int i = 0, e = m_size; i != e; ++i) {
            m_data[i].make_hash();
            m_data[i].value = costs.results(m_data[i].x, cost_constant_);
            m_data[i].remaining_constraints = 0;

            for (int k = 0, end_k = length(constraints_); k != end_k; ++k) {
                int sum = 0;
                for (const auto& elem : constraints_[k].elements) {
                    if (m_data[i].x[elem.variable_index])
                        sum += elem.factor;
                }

                if (!(constraints_[k].min <= sum &&
                      sum <= constraints_[k].max))
                    ++m_data[i].remaining_constraints;
            }
        }

        std::iota(std::begin(m_indices), std::end(m_indices), 0);

        sort();
    }